

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigTest.cpp
# Opt level: O2

void __thiscall jaegertracing::Config_testFromEnv_Test::TestBody(Config_testFromEnv_Test *this)

{
  string *rhs;
  string *rhs_00;
  duration *rhs_01;
  AssertionResult *pAVar1;
  char *pcVar2;
  AssertionResult *pAVar3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_19;
  vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> expectedTags;
  allocator local_2ee;
  allocator local_2ed;
  allocator local_2ec;
  allocator local_2eb;
  allocator local_2ea;
  allocator local_2e9;
  undefined1 local_2e8 [40];
  duration local_2c0;
  vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> tags;
  duration local_298;
  string local_290 [32];
  string local_270;
  string local_250;
  duration local_230;
  string local_228;
  string local_208;
  string local_1e8;
  Config config;
  
  tags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  tags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  tags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&config,"foo",(allocator *)&gtest_ar_2);
  std::vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>::
  emplace_back<char_const(&)[9],std::__cxx11::string>
            ((vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>> *)&tags,
             (char (*) [9])"hostname",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&config);
  std::__cxx11::string::~string((string *)&config);
  std::__cxx11::string::string((string *)&config,"1.2.3",(allocator *)&gtest_ar_2);
  std::vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>::
  emplace_back<char_const(&)[15],std::__cxx11::string>
            ((vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>> *)&tags,
             (char (*) [15])"my.app.version",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&config);
  std::__cxx11::string::~string((string *)&config);
  std::__cxx11::string::string((string *)&local_208,"probabilistic",&local_2e9);
  std::__cxx11::string::string((string *)&local_228,"http://host34:57/sampling",&local_2ea);
  local_230.__r = 0;
  samplers::Config::Config((Config *)&expectedTags,&local_208,0.7,&local_228,0,&local_230);
  local_298.__r = 100000000;
  std::__cxx11::string::string((string *)&local_250,"host35:77",&local_2eb);
  std::__cxx11::string::string((string *)&local_270,"http://host36:56568",&local_2ec);
  reporters::Config::Config((Config *)&gtest_ar_19,10,&local_298,false,&local_250,&local_270);
  propagation::HeadersConfig::HeadersConfig((HeadersConfig *)&gtest_ar_2);
  pcVar2 = "";
  std::__cxx11::string::string(local_290,"",&local_2ed);
  local_2e8[0] = (allocator)0x0;
  std::__cxx11::string::string((string *)(local_2e8 + 8),local_290);
  local_2c0.__r = 0;
  std::__cxx11::string::string((string *)&local_1e8,"test-service",&local_2ee);
  Config::Config(&config,false,(Config *)&expectedTags,(Config *)&gtest_ar_19,
                 (HeadersConfig *)&gtest_ar_2,(RestrictionsConfig *)local_2e8,&local_1e8,&tags);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)(local_2e8 + 8));
  std::__cxx11::string::~string(local_290);
  propagation::HeadersConfig::~HeadersConfig((HeadersConfig *)&gtest_ar_2);
  reporters::Config::~Config((Config *)&gtest_ar_19);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_250);
  samplers::Config::~Config((Config *)&expectedTags);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&local_208);
  jaegertracing::Config::fromEnv();
  std::__cxx11::string::string
            ((string *)&gtest_ar_2,"http://host36:56568",(allocator *)&gtest_ar_19);
  rhs = &config._reporter._endpoint;
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&expectedTags,"std::string(\"http://host36:56568\")",
             "config.reporter().endpoint()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_2,rhs);
  std::__cxx11::string::~string((string *)&gtest_ar_2);
  if ((char)expectedTags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
            ._M_impl.super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&gtest_ar_2);
    if (expectedTags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
        _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
      pcVar2 = ((expectedTags.
                 super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl
                 .super__Vector_impl_data._M_finish)->_key)._M_dataplus._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_19,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/ConfigTest.cpp"
               ,0x7b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_19,(Message *)&gtest_ar_2);
LAB_00199194:
    pAVar1 = (AssertionResult *)&expectedTags;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19);
    pAVar3 = &gtest_ar_2;
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&expectedTags.
                    super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
                    _M_impl.super__Vector_impl_data._M_finish);
    std::__cxx11::string::string((string *)&gtest_ar_2,"host35:77",(allocator *)&gtest_ar_19);
    rhs_00 = &config._reporter._localAgentHostPort;
    testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
              ((internal *)&expectedTags,"std::string(\"host35:77\")",
               "config.reporter().localAgentHostPort()",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_2,
               rhs_00);
    std::__cxx11::string::~string((string *)&gtest_ar_2);
    if ((char)expectedTags.
              super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
              super__Vector_impl_data._M_start == '\0') {
      testing::Message::Message((Message *)&gtest_ar_2);
      if (expectedTags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
          _M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((expectedTags.
                   super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
                   _M_impl.super__Vector_impl_data._M_finish)->_key)._M_dataplus._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_19,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/ConfigTest.cpp"
                 ,0x7c,pcVar2);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_19,(Message *)&gtest_ar_2);
      goto LAB_00199194;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&expectedTags.
                    super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
                    _M_impl.super__Vector_impl_data._M_finish);
    expectedTags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl
    .super__Vector_impl_data._M_start =
         (pointer)CONCAT44(expectedTags.
                           super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,10);
    gtest_ar_19._0_4_ = config._reporter._queueSize;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar_2,"10","config.reporter().queueSize()",(int *)&expectedTags,
               (int *)&gtest_ar_19);
    if (gtest_ar_2.success_ == false) {
      testing::Message::Message((Message *)&expectedTags);
      if (gtest_ar_2.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_19,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/ConfigTest.cpp"
                 ,0x7e,pcVar2);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_19,(Message *)&expectedTags);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_2.message_);
      expectedTags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x64;
      rhs_01 = &config._reporter._bufferFlushInterval;
      testing::internal::
      CmpHelperEQ<std::chrono::duration<long,std::ratio<1l,1000l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                ((internal *)&gtest_ar_2,"std::chrono::milliseconds(100)",
                 "config.reporter().bufferFlushInterval()",
                 (duration<long,_std::ratio<1L,_1000L>_> *)&expectedTags,rhs_01);
      if (gtest_ar_2.success_ == false) {
        testing::Message::Message((Message *)&expectedTags);
        if (gtest_ar_2.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_19,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/ConfigTest.cpp"
                   ,0x80,pcVar2);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_19,(Message *)&expectedTags);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar_2.message_);
        expectedTags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
        _M_impl.super__Vector_impl_data._M_start =
             (pointer)((ulong)expectedTags.
                              super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
                              ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
        gtest_ar_19.success_ = config._reporter._logSpans;
        testing::internal::CmpHelperEQ<bool,bool>
                  ((internal *)&gtest_ar_2,"false","config.reporter().logSpans()",
                   (bool *)&expectedTags,&gtest_ar_19.success_);
        if (gtest_ar_2.success_ == false) {
          testing::Message::Message((Message *)&expectedTags);
          if (gtest_ar_2.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_19,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/ConfigTest.cpp"
                     ,0x81,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_19,(Message *)&expectedTags);
        }
        else {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar_2.message_);
          expectedTags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x3fe6666666666666;
          gtest_ar_19._0_8_ = config._sampler._param;
          testing::internal::CmpHelperEQ<double,double>
                    ((internal *)&gtest_ar_2,".7","config.sampler().param()",(double *)&expectedTags
                     ,(double *)&gtest_ar_19);
          if (gtest_ar_2.success_ != false) {
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr(&gtest_ar_2.message_);
            std::__cxx11::string::string
                      ((string *)&gtest_ar_2,"probabilistic",(allocator *)&gtest_ar_19);
            testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
                      ((internal *)&expectedTags,"std::string(\"probabilistic\")",
                       "config.sampler().type()",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &gtest_ar_2,&config._sampler._type);
            std::__cxx11::string::~string((string *)&gtest_ar_2);
            if ((char)expectedTags.
                      super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
                      _M_impl.super__Vector_impl_data._M_start == '\0') {
              testing::Message::Message((Message *)&gtest_ar_2);
              if (expectedTags.
                  super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
                  _M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
                pcVar2 = "";
              }
              else {
                pcVar2 = ((expectedTags.
                           super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
                           ._M_impl.super__Vector_impl_data._M_finish)->_key)._M_dataplus._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_19,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/ConfigTest.cpp"
                         ,0x84,pcVar2);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_19,(Message *)&gtest_ar_2);
            }
            else {
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&expectedTags.
                                super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
                                ._M_impl.super__Vector_impl_data._M_finish);
              testutils::EnvVariable::setEnv("JAEGER_AGENT_HOST","host33");
              testutils::EnvVariable::setEnv("JAEGER_AGENT_PORT","45");
              testutils::EnvVariable::setEnv("JAEGER_ENDPOINT","http://host34:56567");
              testutils::EnvVariable::setEnv("JAEGER_REPORTER_MAX_QUEUE_SIZE","33");
              testutils::EnvVariable::setEnv("JAEGER_REPORTER_FLUSH_INTERVAL","45");
              testutils::EnvVariable::setEnv("JAEGER_REPORTER_LOG_SPANS","true");
              testutils::EnvVariable::setEnv("JAEGER_SAMPLER_TYPE","remote");
              testutils::EnvVariable::setEnv("JAEGER_SAMPLER_PARAM","0.33");
              testutils::EnvVariable::setEnv("JAEGER_SAMPLING_ENDPOINT","http://myagent:1234");
              testutils::EnvVariable::setEnv("JAEGER_SERVICE_NAME","AService");
              testutils::EnvVariable::setEnv("JAEGER_TAGS","hostname=foobar,my.app.version=4.5.6");
              jaegertracing::Config::fromEnv();
              std::__cxx11::string::string
                        ((string *)&gtest_ar_2,"http://host34:56567",(allocator *)&gtest_ar_19);
              testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
                        ((internal *)&expectedTags,"std::string(\"http://host34:56567\")",
                         "config.reporter().endpoint()",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &gtest_ar_2,rhs);
              std::__cxx11::string::~string((string *)&gtest_ar_2);
              if ((char)expectedTags.
                        super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
                        _M_impl.super__Vector_impl_data._M_start == '\0') {
                testing::Message::Message((Message *)&gtest_ar_2);
                if (expectedTags.
                    super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
                    _M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
                  pcVar2 = "";
                }
                else {
                  pcVar2 = ((expectedTags.
                             super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
                             ._M_impl.super__Vector_impl_data._M_finish)->_key)._M_dataplus._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_19,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/ConfigTest.cpp"
                           ,0x97,pcVar2);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_19,(Message *)&gtest_ar_2);
              }
              else {
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&expectedTags.
                                  super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
                                  ._M_impl.super__Vector_impl_data._M_finish);
                std::__cxx11::string::string
                          ((string *)&gtest_ar_2,"host33:45",(allocator *)&gtest_ar_19);
                testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
                          ((internal *)&expectedTags,"std::string(\"host33:45\")",
                           "config.reporter().localAgentHostPort()",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &gtest_ar_2,rhs_00);
                std::__cxx11::string::~string((string *)&gtest_ar_2);
                if ((char)expectedTags.
                          super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
                          ._M_impl.super__Vector_impl_data._M_start != '\0') {
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)&expectedTags.
                                    super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
                                    ._M_impl.super__Vector_impl_data._M_finish);
                  expectedTags.
                  super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
                  _M_impl.super__Vector_impl_data._M_start =
                       (pointer)CONCAT44(expectedTags.
                                         super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
                                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0x21);
                  gtest_ar_19._0_4_ = config._reporter._queueSize;
                  testing::internal::CmpHelperEQ<int,int>
                            ((internal *)&gtest_ar_2,"33","config.reporter().queueSize()",
                             (int *)&expectedTags,(int *)&gtest_ar_19);
                  if (gtest_ar_2.success_ == false) {
                    testing::Message::Message((Message *)&expectedTags);
                    if (gtest_ar_2.message_.ptr_ ==
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      pcVar2 = "";
                    }
                    else {
                      pcVar2 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&gtest_ar_19,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/ConfigTest.cpp"
                               ,0x9a,pcVar2);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&gtest_ar_19,(Message *)&expectedTags);
                  }
                  else {
                    testing::internal::
                    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::~scoped_ptr(&gtest_ar_2.message_);
                    expectedTags.
                    super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
                    _M_impl.super__Vector_impl_data._M_start = (pointer)0x2d;
                    testing::internal::
                    CmpHelperEQ<std::chrono::duration<long,std::ratio<1l,1000l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                              ((internal *)&gtest_ar_2,"std::chrono::milliseconds(45)",
                               "config.reporter().bufferFlushInterval()",
                               (duration<long,_std::ratio<1L,_1000L>_> *)&expectedTags,rhs_01);
                    if (gtest_ar_2.success_ == false) {
                      testing::Message::Message((Message *)&expectedTags);
                      if (gtest_ar_2.message_.ptr_ ==
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      {
                        pcVar2 = "";
                      }
                      else {
                        pcVar2 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&gtest_ar_19,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/ConfigTest.cpp"
                                 ,0x9c,pcVar2);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&gtest_ar_19,(Message *)&expectedTags);
                    }
                    else {
                      testing::internal::
                      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::~scoped_ptr(&gtest_ar_2.message_);
                      expectedTags.
                      super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
                      _M_impl.super__Vector_impl_data._M_start =
                           (pointer)CONCAT71(expectedTags.
                                             super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
                                             ._M_impl.super__Vector_impl_data._M_start._1_7_,1);
                      gtest_ar_19.success_ = config._reporter._logSpans;
                      testing::internal::CmpHelperEQ<bool,bool>
                                ((internal *)&gtest_ar_2,"true","config.reporter().logSpans()",
                                 (bool *)&expectedTags,&gtest_ar_19.success_);
                      if (gtest_ar_2.success_ != false) {
                        testing::internal::
                        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::~scoped_ptr(&gtest_ar_2.message_);
                        std::__cxx11::string::string
                                  ((string *)&gtest_ar_2,"remote",(allocator *)&gtest_ar_19);
                        testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
                                  ((internal *)&expectedTags,"std::string(\"remote\")",
                                   "config.sampler().type()",
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&gtest_ar_2,&config._sampler._type);
                        std::__cxx11::string::~string((string *)&gtest_ar_2);
                        if ((char)expectedTags.
                                  super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
                                  ._M_impl.super__Vector_impl_data._M_start == '\0') {
                          testing::Message::Message((Message *)&gtest_ar_2);
                          if (expectedTags.
                              super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
                              ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
                            pcVar2 = "";
                          }
                          else {
                            pcVar2 = ((expectedTags.
                                       super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
                                       ._M_impl.super__Vector_impl_data._M_finish)->_key).
                                     _M_dataplus._M_p;
                          }
                          testing::internal::AssertHelper::AssertHelper
                                    ((AssertHelper *)&gtest_ar_19,kFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/ConfigTest.cpp"
                                     ,0x9f,pcVar2);
                          testing::internal::AssertHelper::operator=
                                    ((AssertHelper *)&gtest_ar_19,(Message *)&gtest_ar_2);
                          goto LAB_00199194;
                        }
                        testing::internal::
                        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       *)&expectedTags.
                                          super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
                                          ._M_impl.super__Vector_impl_data._M_finish);
                        expectedTags.
                        super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
                        _M_impl.super__Vector_impl_data._M_start = (pointer)0x3fd51eb851eb851f;
                        gtest_ar_19._0_8_ = config._sampler._param;
                        testing::internal::CmpHelperEQ<double,double>
                                  ((internal *)&gtest_ar_2,"0.33","config.sampler().param()",
                                   (double *)&expectedTags,(double *)&gtest_ar_19);
                        if (gtest_ar_2.success_ == false) {
                          testing::Message::Message((Message *)&expectedTags);
                          if (gtest_ar_2.message_.ptr_ ==
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0) {
                            pcVar2 = "";
                          }
                          else {
                            pcVar2 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
                          }
                          testing::internal::AssertHelper::AssertHelper
                                    ((AssertHelper *)&gtest_ar_19,kFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/ConfigTest.cpp"
                                     ,0xa0,pcVar2);
                          testing::internal::AssertHelper::operator=
                                    ((AssertHelper *)&gtest_ar_19,(Message *)&expectedTags);
                          goto LAB_00199314;
                        }
                        testing::internal::
                        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::~scoped_ptr(&gtest_ar_2.message_);
                        std::__cxx11::string::string
                                  ((string *)&gtest_ar_2,"http://myagent:1234",
                                   (allocator *)&gtest_ar_19);
                        testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
                                  ((internal *)&expectedTags,"std::string(\"http://myagent:1234\")",
                                   "config.sampler().samplingServerURL()",
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&gtest_ar_2,&config._sampler._samplingServerURL);
                        std::__cxx11::string::~string((string *)&gtest_ar_2);
                        if ((char)expectedTags.
                                  super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
                                  ._M_impl.super__Vector_impl_data._M_start == '\0') {
                          testing::Message::Message((Message *)&gtest_ar_2);
                          if (expectedTags.
                              super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
                              ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
                            pcVar2 = "";
                          }
                          else {
                            pcVar2 = ((expectedTags.
                                       super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
                                       ._M_impl.super__Vector_impl_data._M_finish)->_key).
                                     _M_dataplus._M_p;
                          }
                          testing::internal::AssertHelper::AssertHelper
                                    ((AssertHelper *)&gtest_ar_19,kFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/ConfigTest.cpp"
                                     ,0xa1,pcVar2);
                          testing::internal::AssertHelper::operator=
                                    ((AssertHelper *)&gtest_ar_19,(Message *)&gtest_ar_2);
                        }
                        else {
                          testing::internal::
                          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         *)&expectedTags.
                                            super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
                                            ._M_impl.super__Vector_impl_data._M_finish);
                          std::__cxx11::string::string
                                    ((string *)&gtest_ar_2,"AService",(allocator *)&gtest_ar_19);
                          testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
                                    ((internal *)&expectedTags,"std::string(\"AService\")",
                                     "config.serviceName()",
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&gtest_ar_2,&config._serviceName);
                          std::__cxx11::string::~string((string *)&gtest_ar_2);
                          if ((char)expectedTags.
                                    super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
                                    ._M_impl.super__Vector_impl_data._M_start != '\0') {
                            testing::internal::
                            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                           *)&expectedTags.
                                              super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
                                              ._M_impl.super__Vector_impl_data._M_finish);
                            expectedTags.
                            super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
                            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                            expectedTags.
                            super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
                            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                            expectedTags.
                            super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                            std::__cxx11::string::string
                                      ((string *)&gtest_ar_2,"foo",(allocator *)&gtest_ar_19);
                            std::vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>::
                            emplace_back<char_const(&)[9],std::__cxx11::string>
                                      ((vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>
                                        *)&expectedTags,(char (*) [9])"hostname",
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&gtest_ar_2);
                            std::__cxx11::string::~string((string *)&gtest_ar_2);
                            std::__cxx11::string::string
                                      ((string *)&gtest_ar_2,"1.2.3",(allocator *)&gtest_ar_19);
                            std::vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>::
                            emplace_back<char_const(&)[15],std::__cxx11::string>
                                      ((vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>
                                        *)&expectedTags,(char (*) [15])"my.app.version",
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&gtest_ar_2);
                            std::__cxx11::string::~string((string *)&gtest_ar_2);
                            std::__cxx11::string::string
                                      ((string *)&gtest_ar_2,"foobar",(allocator *)&gtest_ar_19);
                            std::vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>::
                            emplace_back<char_const(&)[9],std::__cxx11::string>
                                      ((vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>
                                        *)&expectedTags,(char (*) [9])"hostname",
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&gtest_ar_2);
                            std::__cxx11::string::~string((string *)&gtest_ar_2);
                            std::__cxx11::string::string
                                      ((string *)&gtest_ar_2,"4.5.6",(allocator *)&gtest_ar_19);
                            std::vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>::
                            emplace_back<char_const(&)[15],std::__cxx11::string>
                                      ((vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>
                                        *)&expectedTags,(char (*) [15])"my.app.version",
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&gtest_ar_2);
                            std::__cxx11::string::~string((string *)&gtest_ar_2);
                            testing::internal::
                            CmpHelperEQ<std::vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>,std::vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>>
                                      ((internal *)&gtest_ar_2,"expectedTags","config.tags()",
                                       &expectedTags,&config._tags);
                            if (gtest_ar_2.success_ == false) {
                              testing::Message::Message((Message *)&gtest_ar_19);
                              if (gtest_ar_2.message_.ptr_ ==
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                pcVar2 = "";
                              }
                              else {
                                pcVar2 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
                              }
                              testing::internal::AssertHelper::AssertHelper
                                        ((AssertHelper *)local_2e8,kFatalFailure,
                                         "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/ConfigTest.cpp"
                                         ,0xaa,pcVar2);
                              testing::internal::AssertHelper::operator=
                                        ((AssertHelper *)local_2e8,(Message *)&gtest_ar_19);
LAB_001997d1:
                              pAVar1 = &gtest_ar_2;
                              testing::internal::AssertHelper::~AssertHelper
                                        ((AssertHelper *)local_2e8);
                              pAVar3 = &gtest_ar_19;
LAB_001997eb:
                              testing::internal::
                              scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                             *)pAVar3);
                              testing::internal::
                              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::~scoped_ptr(&pAVar1->message_);
                            }
                            else {
                              testing::internal::
                              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::~scoped_ptr(&gtest_ar_2.message_);
                              gtest_ar_19._0_8_ = gtest_ar_19._0_8_ & 0xffffffffffffff00;
                              local_2e8[0] = (allocator)config._disabled;
                              testing::internal::CmpHelperEQ<bool,bool>
                                        ((internal *)&gtest_ar_2,"false","config.disabled()",
                                         &gtest_ar_19.success_,(bool *)local_2e8);
                              if (gtest_ar_2.success_ == false) {
                                testing::Message::Message((Message *)&gtest_ar_19);
                                if (gtest_ar_2.message_.ptr_ ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar2 = "";
                                }
                                else {
                                  pcVar2 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)local_2e8,kFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/ConfigTest.cpp"
                                           ,0xac,pcVar2);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)local_2e8,(Message *)&gtest_ar_19);
                                goto LAB_001997d1;
                              }
                              testing::internal::
                              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::~scoped_ptr(&gtest_ar_2.message_);
                              testutils::EnvVariable::setEnv("JAEGER_DISABLED","TRue");
                              testutils::EnvVariable::setEnv("JAEGER_AGENT_PORT","445");
                              jaegertracing::Config::fromEnv();
                              gtest_ar_19.success_ = true;
                              local_2e8[0] = (allocator)config._disabled;
                              testing::internal::CmpHelperEQ<bool,bool>
                                        ((internal *)&gtest_ar_2,"true","config.disabled()",
                                         &gtest_ar_19.success_,(bool *)local_2e8);
                              if (gtest_ar_2.success_ == false) {
                                testing::Message::Message((Message *)&gtest_ar_19);
                                if (gtest_ar_2.message_.ptr_ ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar2 = "";
                                }
                                else {
                                  pcVar2 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)local_2e8,kFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/ConfigTest.cpp"
                                           ,0xb2,pcVar2);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)local_2e8,(Message *)&gtest_ar_19);
                                goto LAB_001997d1;
                              }
                              testing::internal::
                              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::~scoped_ptr(&gtest_ar_2.message_);
                              std::__cxx11::string::string
                                        ((string *)&gtest_ar_2,"host33:445",(allocator *)local_2e8);
                              testing::internal::
                              CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
                                        ((internal *)&gtest_ar_19,"std::string(\"host33:445\")",
                                         "config.reporter().localAgentHostPort()",
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&gtest_ar_2,rhs_00);
                              std::__cxx11::string::~string((string *)&gtest_ar_2);
                              if (gtest_ar_19.success_ == false) {
                                testing::Message::Message((Message *)&gtest_ar_2);
                                if (gtest_ar_19.message_.ptr_ ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar2 = "";
                                }
                                else {
                                  pcVar2 = ((gtest_ar_19.message_.ptr_)->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)local_2e8,kFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/ConfigTest.cpp"
                                           ,0xb4,pcVar2);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)local_2e8,(Message *)&gtest_ar_2);
                                pAVar1 = &gtest_ar_19;
                                testing::internal::AssertHelper::~AssertHelper
                                          ((AssertHelper *)local_2e8);
                                pAVar3 = &gtest_ar_2;
                                goto LAB_001997eb;
                              }
                              testing::internal::
                              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::~scoped_ptr(&gtest_ar_19.message_);
                              testutils::EnvVariable::setEnv("JAEGER_AGENT_HOST","");
                              testutils::EnvVariable::setEnv("JAEGER_AGENT_PORT","");
                              testutils::EnvVariable::setEnv("JAEGER_ENDPOINT","");
                              testutils::EnvVariable::setEnv("JAEGER_REPORTER_MAX_QUEUE_SIZE","");
                              testutils::EnvVariable::setEnv("JAEGER_REPORTER_FLUSH_INTERVAL","");
                              testutils::EnvVariable::setEnv("JAEGER_REPORTER_LOG_SPANS","");
                              testutils::EnvVariable::setEnv("JAEGER_SAMPLER_PARAM","");
                              testutils::EnvVariable::setEnv("JAEGER_SAMPLER_TYPE","");
                              testutils::EnvVariable::setEnv("JAEGER_SERVICE_NAME","");
                              testutils::EnvVariable::setEnv("JAEGER_TAGS","");
                              testutils::EnvVariable::setEnv("JAEGER_DISABLED","");
                            }
                            std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::
                            ~vector(&expectedTags);
                            goto LAB_0019933b;
                          }
                          testing::Message::Message((Message *)&gtest_ar_2);
                          if (expectedTags.
                              super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
                              ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
                            pcVar2 = "";
                          }
                          else {
                            pcVar2 = ((expectedTags.
                                       super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
                                       ._M_impl.super__Vector_impl_data._M_finish)->_key).
                                     _M_dataplus._M_p;
                          }
                          testing::internal::AssertHelper::AssertHelper
                                    ((AssertHelper *)&gtest_ar_19,kFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/ConfigTest.cpp"
                                     ,0xa3,pcVar2);
                          testing::internal::AssertHelper::operator=
                                    ((AssertHelper *)&gtest_ar_19,(Message *)&gtest_ar_2);
                        }
                        goto LAB_00199194;
                      }
                      testing::Message::Message((Message *)&expectedTags);
                      if (gtest_ar_2.message_.ptr_ ==
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      {
                        pcVar2 = "";
                      }
                      else {
                        pcVar2 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&gtest_ar_19,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/ConfigTest.cpp"
                                 ,0x9d,pcVar2);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&gtest_ar_19,(Message *)&expectedTags);
                    }
                  }
                  goto LAB_00199314;
                }
                testing::Message::Message((Message *)&gtest_ar_2);
                if (expectedTags.
                    super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
                    _M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
                  pcVar2 = "";
                }
                else {
                  pcVar2 = ((expectedTags.
                             super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
                             ._M_impl.super__Vector_impl_data._M_finish)->_key)._M_dataplus._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_19,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/ConfigTest.cpp"
                           ,0x98,pcVar2);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_19,(Message *)&gtest_ar_2);
              }
            }
            goto LAB_00199194;
          }
          testing::Message::Message((Message *)&expectedTags);
          if (gtest_ar_2.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_19,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/ConfigTest.cpp"
                     ,0x83,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_19,(Message *)&expectedTags);
        }
      }
    }
LAB_00199314:
    pAVar1 = &gtest_ar_2;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19);
    pAVar3 = (AssertionResult *)&expectedTags;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)pAVar3);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&pAVar1->message_);
LAB_0019933b:
  Config::~Config(&config);
  std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector(&tags);
  return;
}

Assistant:

TEST(Config, testFromEnv)
{
    std::vector<Tag> tags;
    tags.emplace_back("hostname", std::string("foo"));
    tags.emplace_back("my.app.version", std::string("1.2.3"));

    Config config(false,
                  samplers::Config("probabilistic",
                                   0.7,
                                   "http://host34:57/sampling",
                                   0,
                                   samplers::Config::Clock::duration()),
                  reporters::Config(10,
                                    std::chrono::milliseconds(100),
                                    false,
                                    "host35:77",
                                    "http://host36:56568"),
                  propagation::HeadersConfig(),
                  baggage::RestrictionsConfig(),
                  "test-service",
                  tags);

    config.fromEnv();

    ASSERT_EQ(std::string("http://host36:56568"), config.reporter().endpoint());
    ASSERT_EQ(std::string("host35:77"), config.reporter().localAgentHostPort());

    ASSERT_EQ(10, config.reporter().queueSize());
    ASSERT_EQ(std::chrono::milliseconds(100),
              config.reporter().bufferFlushInterval());
    ASSERT_EQ(false, config.reporter().logSpans());

    ASSERT_EQ(.7, config.sampler().param());
    ASSERT_EQ(std::string("probabilistic"), config.sampler().type());

    testutils::EnvVariable::setEnv("JAEGER_AGENT_HOST", "host33");
    testutils::EnvVariable::setEnv("JAEGER_AGENT_PORT", "45");
    testutils::EnvVariable::setEnv("JAEGER_ENDPOINT", "http://host34:56567");

    testutils::EnvVariable::setEnv("JAEGER_REPORTER_MAX_QUEUE_SIZE", "33");
    testutils::EnvVariable::setEnv("JAEGER_REPORTER_FLUSH_INTERVAL", "45");
    testutils::EnvVariable::setEnv("JAEGER_REPORTER_LOG_SPANS", "true");

    testutils::EnvVariable::setEnv("JAEGER_SAMPLER_TYPE", "remote");
    testutils::EnvVariable::setEnv("JAEGER_SAMPLER_PARAM", "0.33");
    testutils::EnvVariable::setEnv("JAEGER_SAMPLING_ENDPOINT", "http://myagent:1234");

    testutils::EnvVariable::setEnv("JAEGER_SERVICE_NAME", "AService");
    testutils::EnvVariable::setEnv("JAEGER_TAGS", "hostname=foobar,my.app.version=4.5.6");

    config.fromEnv();

    ASSERT_EQ(std::string("http://host34:56567"), config.reporter().endpoint());
    ASSERT_EQ(std::string("host33:45"), config.reporter().localAgentHostPort());

    ASSERT_EQ(33, config.reporter().queueSize());
    ASSERT_EQ(std::chrono::milliseconds(45),
              config.reporter().bufferFlushInterval());
    ASSERT_EQ(true, config.reporter().logSpans());

    ASSERT_EQ(std::string("remote"), config.sampler().type());
    ASSERT_EQ(0.33, config.sampler().param());
    ASSERT_EQ(std::string("http://myagent:1234"), config.sampler().samplingServerURL());

    ASSERT_EQ(std::string("AService"), config.serviceName());

    std::vector<Tag> expectedTags;
    expectedTags.emplace_back("hostname", std::string("foo"));
    expectedTags.emplace_back("my.app.version", std::string("1.2.3"));
    expectedTags.emplace_back("hostname", std::string("foobar"));
    expectedTags.emplace_back("my.app.version", std::string("4.5.6"));
    ASSERT_EQ(expectedTags, config.tags());

    ASSERT_EQ(false, config.disabled());

    testutils::EnvVariable::setEnv("JAEGER_DISABLED", "TRue");  // case-insensitive
    testutils::EnvVariable::setEnv("JAEGER_AGENT_PORT", "445");

    config.fromEnv();
    ASSERT_EQ(true, config.disabled());
    ASSERT_EQ(std::string("host33:445"),
              config.reporter().localAgentHostPort());

    testutils::EnvVariable::setEnv("JAEGER_AGENT_HOST", "");
    testutils::EnvVariable::setEnv("JAEGER_AGENT_PORT", "");
    testutils::EnvVariable::setEnv("JAEGER_ENDPOINT", "");
    testutils::EnvVariable::setEnv("JAEGER_REPORTER_MAX_QUEUE_SIZE", "");
    testutils::EnvVariable::setEnv("JAEGER_REPORTER_FLUSH_INTERVAL", "");
    testutils::EnvVariable::setEnv("JAEGER_REPORTER_LOG_SPANS", "");
    testutils::EnvVariable::setEnv("JAEGER_SAMPLER_PARAM", "");
    testutils::EnvVariable::setEnv("JAEGER_SAMPLER_TYPE", "");
    testutils::EnvVariable::setEnv("JAEGER_SERVICE_NAME", "");
    testutils::EnvVariable::setEnv("JAEGER_TAGS", "");
    testutils::EnvVariable::setEnv("JAEGER_DISABLED", "");
}